

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Hpipe::Vec<std::__cxx11::string>::push_back_unique<std::__cxx11::string>
          (Vec<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  long lVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  bool bVar8;
  
  lVar1 = *(long *)this;
  bVar8 = *(long *)(this + 8) - lVar1 != 0;
  if (bVar8) {
    uVar7 = *(long *)(this + 8) - lVar1 >> 5;
    __s2 = (val->_M_dataplus)._M_p;
    sVar2 = val->_M_string_length;
    uVar5 = 0;
    uVar6 = 1;
    do {
      unaff_R15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar5 * 0x20 + lVar1);
      __n = *(size_t *)(lVar1 + 8 + uVar5 * 0x20);
      if ((__n == sVar2) &&
         ((__n == 0 || (iVar4 = bcmp((unaff_R15->_M_dataplus)._M_p,__s2,__n), iVar4 == 0)))) break;
      bVar8 = uVar6 < uVar7;
      bVar3 = uVar6 < uVar7;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  if (!bVar8) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,val);
    unaff_R15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(long *)(this + 8) + -0x20);
  }
  return unaff_R15;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }